

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int do_buf(uchar *buf,int buflen,int encoding,unsigned_long flags,char *quotes,BIO *out)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  size_t sVar4;
  bool local_e5;
  bool local_c1;
  int len_1;
  int len;
  size_t i;
  size_t utf8_len;
  CBB utf8_cbb;
  uint8_t utf8_buf [6];
  int is_last;
  uint32_t c;
  int is_first;
  int outlen;
  CBS cbs;
  code *pcStack_40;
  int get_char_error;
  _func_int_CBS_ptr_uint32_t_ptr *get_char;
  BIO *out_local;
  char *quotes_local;
  unsigned_long flags_local;
  int encoding_local;
  int buflen_local;
  uchar *buf_local;
  
  switch(encoding) {
  case 0x1000:
    pcStack_40 = CBS_get_utf8;
    cbs.len._4_4_ = 0x96;
    break;
  case 0x1001:
    pcStack_40 = CBS_get_latin1;
    cbs.len._4_4_ = 0x44;
    break;
  case 0x1002:
    pcStack_40 = CBS_get_ucs2_be;
    cbs.len._4_4_ = 0x8e;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                  ,0x73,"int do_buf(const unsigned char *, int, int, unsigned long, char *, BIO *)")
    ;
  case 0x1004:
    pcStack_40 = CBS_get_utf32_be;
    cbs.len._4_4_ = 0x95;
  }
  CBS_init((CBS *)&is_first,buf,(long)buflen);
  c = 0;
  while( true ) {
    sVar2 = CBS_len((CBS *)&is_first);
    if (sVar2 == 0) {
      return c;
    }
    puVar3 = CBS_data((CBS *)&is_first);
    iVar1 = (*pcStack_40)(&is_first);
    if (iVar1 == 0) break;
    sVar2 = CBS_len((CBS *)&is_first);
    if ((flags & 0x10) == 0) {
      iVar1 = do_esc_char(utf8_buf._2_4_,flags,quotes,out,(uint)(puVar3 == buf),(uint)(sVar2 == 0));
      if (iVar1 < 0) {
        return -1;
      }
      c = iVar1 + c;
    }
    else {
      CBB_init_fixed((CBB *)&utf8_len,(uint8_t *)((long)&utf8_cbb.u + 0x1a),6);
      iVar1 = CBB_add_utf8((CBB *)&utf8_len,utf8_buf._2_4_);
      if (iVar1 == 0) {
        ERR_put_error(0xc,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                      ,0x87);
        return 1;
      }
      sVar4 = CBB_len((CBB *)&utf8_len);
      for (_len_1 = 0; _len_1 < sVar4; _len_1 = _len_1 + 1) {
        local_c1 = (puVar3 == buf) != 0 && _len_1 == 0;
        local_e5 = (sVar2 == 0) != 0 && _len_1 == sVar4 - 1;
        iVar1 = do_esc_char((uint)*(byte *)((long)&utf8_cbb.u + _len_1 + 0x1a),flags,quotes,out,
                            (uint)local_c1,(uint)local_e5);
        if (iVar1 < 0) {
          return -1;
        }
        c = iVar1 + c;
      }
    }
  }
  ERR_put_error(0xc,0,cbs.len._4_4_,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                ,0x7e);
  return -1;
}

Assistant:

static int do_buf(const unsigned char *buf, int buflen, int encoding,
                  unsigned long flags, char *quotes, BIO *out) {
  int (*get_char)(CBS *cbs, uint32_t *out);
  int get_char_error;
  switch (encoding) {
    case MBSTRING_UNIV:
      get_char = CBS_get_utf32_be;
      get_char_error = ASN1_R_INVALID_UNIVERSALSTRING;
      break;
    case MBSTRING_BMP:
      get_char = CBS_get_ucs2_be;
      get_char_error = ASN1_R_INVALID_BMPSTRING;
      break;
    case MBSTRING_ASC:
      get_char = CBS_get_latin1;
      get_char_error = ERR_R_INTERNAL_ERROR;  // Should not be possible.
      break;
    case MBSTRING_UTF8:
      get_char = CBS_get_utf8;
      get_char_error = ASN1_R_INVALID_UTF8STRING;
      break;
    default:
      assert(0);
      return -1;
  }

  CBS cbs;
  CBS_init(&cbs, buf, buflen);
  int outlen = 0;
  while (CBS_len(&cbs) != 0) {
    const int is_first = CBS_data(&cbs) == buf;
    uint32_t c;
    if (!get_char(&cbs, &c)) {
      OPENSSL_PUT_ERROR(ASN1, get_char_error);
      return -1;
    }
    const int is_last = CBS_len(&cbs) == 0;
    if (flags & ASN1_STRFLGS_UTF8_CONVERT) {
      uint8_t utf8_buf[6];
      CBB utf8_cbb;
      CBB_init_fixed(&utf8_cbb, utf8_buf, sizeof(utf8_buf));
      if (!CBB_add_utf8(&utf8_cbb, c)) {
        OPENSSL_PUT_ERROR(ASN1, ERR_R_INTERNAL_ERROR);
        return 1;
      }
      size_t utf8_len = CBB_len(&utf8_cbb);
      for (size_t i = 0; i < utf8_len; i++) {
        int len = do_esc_char(utf8_buf[i], flags, quotes, out,
                              is_first && i == 0, is_last && i == utf8_len - 1);
        if (len < 0) {
          return -1;
        }
        outlen += len;
      }
    } else {
      int len = do_esc_char(c, flags, quotes, out, is_first, is_last);
      if (len < 0) {
        return -1;
      }
      outlen += len;
    }
  }
  return outlen;
}